

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

double anon_unknown.dwarf_c3752::ParseDouble(ExpressionContext *ctx,char *str)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = 0.0;
  dVar8 = 0.0;
  cVar2 = (char)ctx->optimizationLevel;
  while ((int)cVar2 - 0x30U < 10) {
    dVar8 = dVar8 * 10.0 + (double)(int)((int)cVar2 - 0x30U);
    piVar1 = &ctx->optimizationLevel;
    ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
    cVar2 = *(char *)((long)piVar1 + 1);
  }
  if (cVar2 == '.') {
    cVar2 = *(char *)((long)&ctx->optimizationLevel + 1);
    ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
    uVar4 = (int)cVar2 - 0x30;
    if (uVar4 < 10) {
      dVar6 = 0.0;
      dVar7 = 0.1;
      do {
        dVar6 = dVar6 + (double)(int)uVar4 * dVar7;
        dVar7 = dVar7 / 10.0;
        cVar2 = *(char *)((long)&ctx->optimizationLevel + 1);
        ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
        uVar4 = (int)cVar2 - 0x30;
      } while (uVar4 < 10);
    }
  }
  if (cVar2 != 'e') {
    return dVar8 + dVar6;
  }
  iVar3 = (int)*(char *)((long)&ctx->optimizationLevel + 1);
  if (iVar3 == 0x2d) {
    uVar4 = (int)*(char *)((long)&ctx->optimizationLevel + 2) - 0x30;
    iVar3 = 0;
    if (uVar4 < 10) {
      pcVar5 = (char *)((long)&ctx->optimizationLevel + 3);
      iVar3 = 0;
      do {
        iVar3 = uVar4 + iVar3 * 10;
        uVar4 = (int)*pcVar5 - 0x30;
        pcVar5 = pcVar5 + 1;
      } while (uVar4 < 10);
    }
    iVar3 = -iVar3;
  }
  else {
    uVar4 = iVar3 - 0x30;
    dVar7 = 0.0;
    if (9 < uVar4) goto LAB_0016a024;
    pcVar5 = (char *)((long)&ctx->optimizationLevel + 2);
    iVar3 = 0;
    do {
      iVar3 = uVar4 + iVar3 * 10;
      uVar4 = (int)*pcVar5 - 0x30;
      pcVar5 = pcVar5 + 1;
    } while (uVar4 < 10);
  }
  dVar7 = (double)iVar3;
LAB_0016a024:
  dVar7 = pow(10.0,dVar7);
  return (dVar8 + dVar6) * dVar7;
}

Assistant:

double ParseDouble(ExpressionContext &ctx, const char *str)
	{
		unsigned digit;
		double integer = 0.0;

		while((digit = *str - '0') < 10)
		{
			integer = integer * 10.0 + digit;
			str++;
		}

		double fractional = 0.0;
	
		if(*str == '.')
		{
			double power = 0.1;
			str++;

			while((digit = *str - '0') < 10)
			{
				fractional = fractional + power * digit;
				power /= 10.0;
				str++;
			}
		}

		if(*str == 'e')
		{
			str++;

			if(*str == '-')
				return (integer + fractional) * pow(10.0, (double)-ParseInteger(ctx, str + 1));
			else
				return (integer + fractional) * pow(10.0, (double)ParseInteger(ctx, str));
		}

		return integer + fractional;
	}